

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cencode.c
# Opt level: O2

int base64_encode_blockend(char *code_out,base64_encodestate *state_in)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  char *codechar;
  long lStack_8;
  
  iVar3 = (int)code_out;
  if (state_in->step == step_C) {
    cVar1 = '=';
    if ((long)state_in->result < 0x40) {
      cVar1 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_"[state_in->result];
    }
    pcVar2 = code_out + 1;
    *code_out = cVar1;
    lStack_8 = 2;
  }
  else {
    if (state_in->step != step_B) goto LAB_00112f9e;
    cVar1 = '=';
    if ((long)state_in->result < 0x40) {
      cVar1 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_"[state_in->result];
    }
    *code_out = cVar1;
    pcVar2 = code_out + 2;
    code_out[1] = '=';
    lStack_8 = 3;
  }
  code_out = code_out + lStack_8;
  *pcVar2 = '=';
LAB_00112f9e:
  *code_out = '\n';
  return ((int)code_out - iVar3) + 1;
}

Assistant:

int base64_encode_blockend(char* code_out, base64_encodestate* state_in)
{
	char* codechar = code_out;
	
	switch (state_in->step)
	{
	case step_B:
		*codechar++ = base64url_encode_value(state_in->result);
		*codechar++ = '=';
		*codechar++ = '=';
		break;
	case step_C:
		*codechar++ = base64url_encode_value(state_in->result);
		*codechar++ = '=';
		break;
	case step_A:
		break;
	}
	*codechar++ = '\n';
	
	return codechar - code_out;
}